

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin("/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_websocket.c"
            );
  UnityDefaultTestRun(test_receive_unfragmented_frames,"test_receive_unfragmented_frames",0xb69);
  UnityDefaultTestRun(test_receive_unfragmented_frames_in_parts,
                      "test_receive_unfragmented_frames_in_parts",0xb6a);
  UnityDefaultTestRun(test_receive_fragmented_frames,"test_receive_fragmented_frames",0xb6b);
  UnityDefaultTestRun(test_incoming_ping_pong_send_fails,"test_incoming_ping_pong_send_fails",0xb6d)
  ;
  UnityDefaultTestRun(test_close_close_response_fails,"test_close_close_response_fails",0xb6e);
  UnityDefaultTestRun(test_close_self_sendframe_fails,"test_close_self_sendframe_fails",0xb6f);
  UnityDefaultTestRun(test_send_multiple_jobs_with_failures,"test_send_multiple_jobs_with_failures",
                      0xb70);
  UnityDefaultTestRun(test_immediate_read_error_for_get_header,
                      "test_immediate_read_error_for_get_header",0xb72);
  UnityDefaultTestRun(test_immediate_read_error_for_get_first_length,
                      "test_immediate_read_error_for_get_first_length",0xb73);
  UnityDefaultTestRun(test_immediate_read_error_for_get_mask,
                      "test_immediate_read_error_for_get_mask",0xb74);
  UnityDefaultTestRun(test_immediate_read_error_for_get_extended_length,
                      "test_immediate_read_error_for_get_extended_length",0xb75);
  UnityDefaultTestRun(test_immediate_read_error_for_get_payload,
                      "test_immediate_read_error_for_get_payload",0xb76);
  UnityDefaultTestRun(test_immediate_read_error_for_second_get_payload,
                      "test_immediate_read_error_for_second_get_payload",0xb77);
  UnityDefaultTestRun(test_read_error_in_get_header,"test_read_error_in_get_header",0xb79);
  UnityDefaultTestRun(test_read_error_in_get_mask,"test_read_error_in_get_mask",0xb7a);
  UnityDefaultTestRun(test_read_error_in_get_payload,"test_read_error_in_get_payload",0xb7b);
  UnityDefaultTestRun(test_read_no_utf8,"test_read_no_utf8",0xb7c);
  UnityDefaultTestRun(test_receive_ping_frame,"test_receive_ping_frame",0xb7e);
  UnityDefaultTestRun(test_receive_ping_frame_no_payload,"test_receive_ping_frame_no_payload",0xb7f)
  ;
  UnityDefaultTestRun(test_receive_ping_frame_no_callback,"test_receive_ping_frame_no_callback",
                      0xb80);
  UnityDefaultTestRun(test_receive_ping_frame_payload_too_long,
                      "test_receive_ping_frame_payload_too_long",0xb81);
  UnityDefaultTestRun(test_recieve_ping_frame_payload_too_long_no_error_callback,
                      "test_recieve_ping_frame_payload_too_long_no_error_callback",0xb82);
  UnityDefaultTestRun(test_receive_ping_frame_restart_receive_fails_after_pong_written,
                      "test_receive_ping_frame_restart_receive_fails_after_pong_written",0xb83);
  UnityDefaultTestRun(test_receive_pong_frame,"test_receive_pong_frame",0xb85);
  UnityDefaultTestRun(test_receive_pong_frame_no_callback,"test_receive_pong_frame_no_callback",
                      0xb86);
  UnityDefaultTestRun(test_receive_pong_frame_restart_receive_fails,
                      "test_receive_pong_frame_restart_receive_fails",0xb87);
  UnityDefaultTestRun(test_illegal_opcode,"test_illegal_opcode",0xb89);
  UnityDefaultTestRun(test_wrong_opcode_between_fragments,"test_wrong_opcode_between_fragments",
                      0xb8a);
  UnityDefaultTestRun(test_wrong_opcode_in_fragment,"test_wrong_opcode_in_fragment",0xb8b);
  UnityDefaultTestRun(test_control_frame_within_fragment,"test_control_frame_within_fragment",0xb8c)
  ;
  UnityDefaultTestRun(test_binary_frame_within_text_fragments,
                      "test_binary_frame_within_text_fragments",0xb8d);
  UnityDefaultTestRun(test_rsv_bit_in_header,"test_rsv_bit_in_header",0xb8f);
  UnityDefaultTestRun(test_fragmented_control_frame,"test_fragmented_control_frame",0xb90);
  UnityDefaultTestRun(test_wrong_continuation_frame_without_correct_start_frame,
                      "test_wrong_continuation_frame_without_correct_start_frame",0xb91);
  UnityDefaultTestRun(test_wrong_fragment_start,"test_wrong_fragment_start",0xb92);
  UnityDefaultTestRun(test_no_mask_set_from_client,"test_no_mask_set_from_client",0xb93);
  UnityDefaultTestRun(test_close_self_no_answer,"test_close_self_no_answer",0xb95);
  UnityDefaultTestRun(test_close_in_get_header,"test_close_in_get_header",0xb97);
  UnityDefaultTestRun(test_close_in_get_length,"test_close_in_get_length",0xb98);
  UnityDefaultTestRun(test_close_in_get_mask,"test_close_in_get_mask",0xb99);
  UnityDefaultTestRun(test_close_in_get_payload,"test_close_in_get_payload",0xb9a);
  UnityDefaultTestRun(test_close_self_no_reason,"test_close_self_no_reason",0xb9c);
  UnityDefaultTestRun(test_close_self_with_reason,"test_close_self_with_reason",0xb9d);
  UnityDefaultTestRun(test_close_self_no_ws,"test_close_self_no_ws",0xb9e);
  UnityDefaultTestRun(test_close_self_no_handler,"test_close_self_no_handler",0xb9f);
  UnityDefaultTestRun(test_close_self_twice,"test_close_self_twice",0xba0);
  UnityDefaultTestRun(test_close_self_timer_init_fails,"test_close_self_timer_init_fails",0xba1);
  UnityDefaultTestRun(test_close_self_timer_expire_fails,"test_close_self_timer_expire_fails",0xba2)
  ;
  UnityDefaultTestRun(test_close_self_without_read,"test_close_self_without_read",0xba3);
  UnityDefaultTestRun(test_close_self_without_close_hook,"test_close_self_without_close_hook",0xba4)
  ;
  UnityDefaultTestRun(test_close_with_invalid_status_codes,"test_close_with_invalid_status_codes",
                      0xba5);
  UnityDefaultTestRun(test_close_with_valid_status_codes,"test_close_with_valid_status_codes",0xba6)
  ;
  UnityDefaultTestRun(test_close_reason_not_utf8,"test_close_reason_not_utf8",0xba7);
  UnityDefaultTestRun(test_text_frame_utf8_no_complete_in_last_frame,
                      "test_text_frame_utf8_no_complete_in_last_frame",0xba8);
  UnityDefaultTestRun(test_close_short_status,"test_close_short_status",0xbaa);
  UnityDefaultTestRun(test_send_pong_frame,"test_send_pong_frame",0xbac);
  UnityDefaultTestRun(test_send_pong_frame_no_ws,"test_send_pong_frame_no_ws",0xbad);
  UnityDefaultTestRun(test_send_ping_frame_no_ws,"test_send_ping_frame_no_ws",0xbae);
  UnityDefaultTestRun(test_send_pong_frame_no_handler,"test_send_pong_frame_no_handler",0xbaf);
  UnityDefaultTestRun(test_send_pong_frame_payload_too_large,
                      "test_send_pong_frame_payload_too_large",0xbb0);
  UnityDefaultTestRun(test_send_pong_frame_twice,"test_send_pong_frame_twice",0xbb1);
  UnityDefaultTestRun(test_send_ping_frame,"test_send_ping_frame",0xbb3);
  UnityDefaultTestRun(test_send_text_binary_frame,"test_send_text_binary_frame",0xbb5);
  UnityDefaultTestRun(test_send_chunks,"test_send_chunks",0xbb6);
  UnityDefaultTestRun(test_send_fragmented_text_frame,"test_send_fragmented_text_frame",2999);
  UnityDefaultTestRun(test_send_text_frame_no_ws,"test_send_text_frame_no_ws",3000);
  UnityDefaultTestRun(test_send_text_frame_no_handler,"test_send_text_frame_no_handler",0xbb9);
  UnityDefaultTestRun(test_send_text_frame_twice,"test_send_text_frame_twice",0xbba);
  UnityDefaultTestRun(test_send_multiple_jobs,"test_send_multiple_jobs",0xbbc);
  UnityDefaultTestRun(test_send_multiple_jobs_starting_with_close,
                      "test_send_multiple_jobs_starting_with_close",0xbbd);
  UnityDefaultTestRun(test_client_init,"test_client_init",0xbbf);
  UnityDefaultTestRun(test_client_init_without_ws,"test_client_init_without_ws",0xbc0);
  UnityDefaultTestRun(test_client_init_without_on_connect,"test_client_init_without_on_connect",
                      0xbc1);
  UnityDefaultTestRun(test_server_init,"test_server_init",0xbc3);
  UnityDefaultTestRun(test_server_init_without_ws,"test_server_init_without_ws",0xbc4);
  UnityDefaultTestRun(test_server_init_without_on_connect,"test_server_init_without_on_connect",
                      0xbc5);
  UnityDefaultTestRun(test_read_message_no_websocket,"test_read_message_no_websocket",0xbc7);
  UnityDefaultTestRun(test_read_message_no_handler,"test_read_message_no_handler",0xbc8);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();

	RUN_TEST(test_receive_unfragmented_frames);
	RUN_TEST(test_receive_unfragmented_frames_in_parts);
	RUN_TEST(test_receive_fragmented_frames);

	RUN_TEST(test_incoming_ping_pong_send_fails);
	RUN_TEST(test_close_close_response_fails);
	RUN_TEST(test_close_self_sendframe_fails);
	RUN_TEST(test_send_multiple_jobs_with_failures);

	RUN_TEST(test_immediate_read_error_for_get_header);
	RUN_TEST(test_immediate_read_error_for_get_first_length);
	RUN_TEST(test_immediate_read_error_for_get_mask);
	RUN_TEST(test_immediate_read_error_for_get_extended_length);
	RUN_TEST(test_immediate_read_error_for_get_payload);
	RUN_TEST(test_immediate_read_error_for_second_get_payload);

	RUN_TEST(test_read_error_in_get_header);
	RUN_TEST(test_read_error_in_get_mask);
	RUN_TEST(test_read_error_in_get_payload);
	RUN_TEST(test_read_no_utf8);

	RUN_TEST(test_receive_ping_frame);
	RUN_TEST(test_receive_ping_frame_no_payload);
	RUN_TEST(test_receive_ping_frame_no_callback);
	RUN_TEST(test_receive_ping_frame_payload_too_long);
	RUN_TEST(test_recieve_ping_frame_payload_too_long_no_error_callback);
	RUN_TEST(test_receive_ping_frame_restart_receive_fails_after_pong_written);

	RUN_TEST(test_receive_pong_frame);
	RUN_TEST(test_receive_pong_frame_no_callback);
	RUN_TEST(test_receive_pong_frame_restart_receive_fails);

	RUN_TEST(test_illegal_opcode);
	RUN_TEST(test_wrong_opcode_between_fragments);
	RUN_TEST(test_wrong_opcode_in_fragment);
	RUN_TEST(test_control_frame_within_fragment);
	RUN_TEST(test_binary_frame_within_text_fragments);

	RUN_TEST(test_rsv_bit_in_header);
	RUN_TEST(test_fragmented_control_frame);
	RUN_TEST(test_wrong_continuation_frame_without_correct_start_frame);
	RUN_TEST(test_wrong_fragment_start);
	RUN_TEST(test_no_mask_set_from_client);

	RUN_TEST(test_close_self_no_answer);

	RUN_TEST(test_close_in_get_header);
	RUN_TEST(test_close_in_get_length);
	RUN_TEST(test_close_in_get_mask);
	RUN_TEST(test_close_in_get_payload);

	RUN_TEST(test_close_self_no_reason);
	RUN_TEST(test_close_self_with_reason);
	RUN_TEST(test_close_self_no_ws);
	RUN_TEST(test_close_self_no_handler);
	RUN_TEST(test_close_self_twice);
	RUN_TEST(test_close_self_timer_init_fails);
	RUN_TEST(test_close_self_timer_expire_fails);
	RUN_TEST(test_close_self_without_read);
	RUN_TEST(test_close_self_without_close_hook);
	RUN_TEST(test_close_with_invalid_status_codes);
	RUN_TEST(test_close_with_valid_status_codes);
	RUN_TEST(test_close_reason_not_utf8);
	RUN_TEST(test_text_frame_utf8_no_complete_in_last_frame);

	RUN_TEST(test_close_short_status);

	RUN_TEST(test_send_pong_frame);
	RUN_TEST(test_send_pong_frame_no_ws);
	RUN_TEST(test_send_ping_frame_no_ws);
	RUN_TEST(test_send_pong_frame_no_handler);
	RUN_TEST(test_send_pong_frame_payload_too_large);
	RUN_TEST(test_send_pong_frame_twice);

	RUN_TEST(test_send_ping_frame);

	RUN_TEST(test_send_text_binary_frame);
	RUN_TEST(test_send_chunks);
	RUN_TEST(test_send_fragmented_text_frame);
	RUN_TEST(test_send_text_frame_no_ws);
	RUN_TEST(test_send_text_frame_no_handler);
	RUN_TEST(test_send_text_frame_twice);

	RUN_TEST(test_send_multiple_jobs);
	RUN_TEST(test_send_multiple_jobs_starting_with_close);

	RUN_TEST(test_client_init);
	RUN_TEST(test_client_init_without_ws);
	RUN_TEST(test_client_init_without_on_connect);

	RUN_TEST(test_server_init);
	RUN_TEST(test_server_init_without_ws);
	RUN_TEST(test_server_init_without_on_connect);

	RUN_TEST(test_read_message_no_websocket);
	RUN_TEST(test_read_message_no_handler);

	return UNITY_END();
}